

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_free(REF_NODE ref_node)

{
  if (ref_node != (REF_NODE)0x0) {
    free(ref_node->unused_global);
    free(ref_node->aux);
    free(ref_node->real);
    free(ref_node->age);
    free(ref_node->part);
    free(ref_node->sorted_local);
    free(ref_node->sorted_global);
    free(ref_node->global);
    free(ref_node);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_free(REF_NODE ref_node) {
  if (NULL == (void *)ref_node) return REF_NULL;
  ref_free(ref_node->unused_global);
  /* ref_mpi reference only */
  ref_free(ref_node->aux);
  ref_free(ref_node->real);
  ref_free(ref_node->age);
  ref_free(ref_node->part);
  ref_free(ref_node->sorted_local);
  ref_free(ref_node->sorted_global);
  ref_free(ref_node->global);
  ref_free(ref_node);
  return REF_SUCCESS;
}